

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O3

int do_look(boolean quick)

{
  nh_menuitem *pnVar1;
  obj *poVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint extraout_EAX;
  uint extraout_EAX_00;
  undefined8 extraout_RAX;
  ulong uVar10;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  undefined7 extraout_var;
  undefined8 extraout_RAX_03;
  boolean in_CL;
  boolean without_asking;
  long lVar11;
  nh_desc_buf *__src;
  undefined7 in_register_00000039;
  char *line;
  uint uVar12;
  coord cc;
  menulist menu;
  int selected [1];
  char out_str [256];
  char firstmatch [256];
  nh_desc_buf descbuf;
  coord local_852;
  menulist local_850;
  uint local_840;
  int local_83c;
  byte local_838 [256];
  char local_738 [260];
  nh_desc_buf local_634;
  
  if (quick == '\0') {
    cVar4 = yn_function("Specify unknown object by cursor?","ynq",'q');
    if (cVar4 == 'q') {
      return (uint)CONCAT71(extraout_var,cVar4);
    }
    if (cVar4 != 'y') {
      getlin("Specify what? (type the word)",(char *)local_838);
      if (local_838[0] == 0) {
        return (uint)local_838[0];
      }
      if (local_838[0] == 0x1b) {
        return (uint)local_838[0];
      }
      checkfile((char *)local_838,(permonst *)0x1,'\x01',in_CL);
      return extraout_EAX;
    }
  }
  bVar3 = flags.verbose;
  local_852.x = u.ux;
  local_852.y = u.uy;
  flags.verbose = flags.verbose != '\0' && quick == '\0';
  local_840 = (uint)CONCAT71(in_register_00000039,quick);
  do {
    local_838[0] = 0;
    if (flags.verbose == '\0') {
      pline("Pick an object.");
    }
    else {
      pline("Please move the cursor to %s.");
    }
    iVar5 = getpos(&local_852,'\0',"an unknown object");
    if ((iVar5 < 0) || (local_852.x < '\0')) {
      if (bVar3 == '\0') {
        flags.verbose = bVar3;
        return local_840;
      }
      line = "Never mind.";
      if ((char)local_840 == '\0') {
        line = "Done.";
      }
      goto LAB_0020f14d;
    }
    flags.verbose = '\0';
    nh_describe_pos((uint)(byte)local_852.x,(int)local_852.y,&local_634);
    poVar2 = level->objects[local_852.x][local_852.y];
    uVar12 = 0;
    iVar8 = 0;
    if ((poVar2 != (obj *)0x0) && ((1 < poVar2->quan || (poVar2->oartifact == '\x1d')))) {
      iVar8 = 1;
    }
    init_menulist(&local_850);
    local_838[0] = 0;
    iVar6 = append_str((char *)local_838,local_634.effectdesc,0);
    if (iVar6 != 0) {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x65;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.effectdesc);
      local_850.icount = local_850.icount + 1;
      strcpy(local_738,local_634.effectdesc);
      uVar12 = 1;
    }
    iVar7 = append_str((char *)local_838,local_634.invisdesc,0);
    if (iVar7 != 0) {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x69;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.invisdesc);
      local_850.icount = local_850.icount + 1;
      uVar12 = 2;
      if (iVar6 == 0) {
        strcpy(local_738,local_634.invisdesc);
        uVar12 = 1;
      }
    }
    iVar6 = append_str((char *)local_838,local_634.mondesc,0);
    if (iVar6 != 0) {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x6d;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.mondesc);
      local_850.icount = local_850.icount + 1;
      if (uVar12 == 0) {
        strcpy(local_738,local_634.mondesc);
        uVar12 = 1;
      }
      else {
        uVar12 = uVar12 + 1;
      }
    }
    iVar8 = append_str((char *)local_838,local_634.objdesc,iVar8);
    if (iVar8 == 0) {
      cVar4 = (char)local_840;
    }
    else {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      cVar4 = (char)local_840;
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x6f;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.objdesc);
      local_850.icount = local_850.icount + 1;
      if (uVar12 == 0) {
        strcpy(local_738,local_634.objdesc);
        uVar12 = 1;
      }
      else {
        uVar12 = uVar12 + 1;
      }
    }
    iVar8 = append_str((char *)local_838,local_634.trapdesc,0);
    if (iVar8 != 0) {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x74;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.trapdesc);
      local_850.icount = local_850.icount + 1;
      if (uVar12 == 0) {
        strcpy(local_738,local_634.trapdesc);
        uVar12 = 1;
      }
      else {
        uVar12 = uVar12 + 1;
      }
    }
    iVar8 = append_str((char *)local_838,local_634.bgdesc,0);
    if ((iVar8 == 0) || (uVar12 != 0)) {
      if (uVar12 != 0) goto LAB_0020ef58;
      pline("I\'ve never heard of such things.");
      uVar10 = extraout_RAX_00;
    }
    else {
      lVar11 = (long)local_850.size;
      if (local_850.size <= local_850.icount) {
        local_850.size = local_850.size * 2;
        local_850.items = (nh_menuitem *)realloc(local_850.items,lVar11 * 0x218);
      }
      pnVar1 = local_850.items + local_850.icount;
      pnVar1->id = 0x62;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_634.bgdesc);
      local_850.icount = local_850.icount + 1;
      strcpy(local_738,local_634.bgdesc);
      uVar12 = 1;
LAB_0020ef58:
      local_838[0] = highc(local_838[0]);
      pline("%s.");
      without_asking = (boolean)(iVar5 - 1U);
      uVar10 = CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar5 != 3);
      if ((1 < iVar5 - 1U) && (cVar4 == '\0' || iVar5 == 3)) {
        if (1 < uVar12) {
          without_asking = '\x01';
          uVar9 = display_menu(local_850.items,local_850.icount,"More info?",1,&local_83c);
          uVar10 = (ulong)uVar9;
          if (uVar9 != 1) goto LAB_0020f06a;
          if (local_83c < 0x6d) {
            if (local_83c == 0x62) {
              __src = &local_634;
            }
            else {
              __src = (nh_desc_buf *)local_634.effectdesc;
              if ((local_83c != 0x65) &&
                 (__src = (nh_desc_buf *)local_634.invisdesc, local_83c != 0x69)) goto LAB_0020f046;
            }
          }
          else {
            __src = (nh_desc_buf *)local_634.mondesc;
            if (((local_83c != 0x6d) &&
                (__src = (nh_desc_buf *)local_634.objdesc, local_83c != 0x6f)) &&
               (__src = (nh_desc_buf *)local_634.trapdesc, local_83c != 0x74)) goto LAB_0020f046;
          }
          strcpy(local_738,__src->bgdesc);
        }
LAB_0020f046:
        checkfile(local_738,(permonst *)(ulong)(1 < uVar12),iVar5 == 3 || 1 < uVar12,without_asking)
        ;
        uVar10 = extraout_RAX_01;
      }
    }
LAB_0020f06a:
    if (local_850.icount != 0) {
      free(local_850.items);
      uVar10 = extraout_RAX_02;
    }
    if (cVar4 != '\0') {
      check_tutorial_farlook((int)local_852.x,(int)local_852.y);
      flags.verbose = bVar3;
      return (uint)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),bVar3);
    }
  } while (iVar5 != 2);
  uVar12 = (uint)CONCAT71((int7)(uVar10 >> 8),bVar3);
  flags.verbose = bVar3;
  if (bVar3 != '\0') {
    line = "Done.";
LAB_0020f14d:
    flags.verbose = bVar3;
    pline(line);
    uVar12 = extraout_EAX_00;
  }
  return uVar12;
}

Assistant:

static int do_look(boolean quick)
{
    char out_str[BUFSZ];
    char firstmatch[BUFSZ];
    int i, ans = 0, objplur = 0;
    int found;		/* count of matching syms found */
    coord cc;		/* screen pos of unknown glyph */
    boolean save_verbose;	/* saved value of flags.verbose */
    boolean from_screen;	/* question from the screen */
    struct nh_desc_buf descbuf;
    struct obj *otmp;
    struct menulist menu;
    int n, selected[1];

    if (quick) {
	from_screen = TRUE;	/* yes, we want to use the cursor */
    } else {
	i = ynq("Specify unknown object by cursor?");
	if (i == 'q') return 0;
	from_screen = (i == 'y');
    }

    if (from_screen) {
	cc.x = u.ux;
	cc.y = u.uy;
    } else {
	getlin("Specify what? (type the word)", out_str);
	if (out_str[0] == '\0' || out_str[0] == '\033')
	    return 0;

	/* the ability to specify symbols is gone: it is simply impossible to
	 * know how the window port is displaying things (tiles?) and even if
	 * charaters are used it may not be possible to type them (utf8)
	 */
	
	checkfile(out_str, NULL, TRUE, TRUE);
	return 0;
    }
    /* Save the verbose flag, we change it later. */
    save_verbose = flags.verbose;
    flags.verbose = flags.verbose && !quick;
    
    /*
     * we're identifying from the screen.
     */
    do {
	/* Reset some variables. */
	found = 0;
	out_str[0] = '\0';
	objplur = 0;

	if (flags.verbose)
	    pline("Please move the cursor to %s.",
		    what_is_an_unknown_object);
	else
	    pline("Pick an object.");

	ans = getpos(&cc, FALSE, what_is_an_unknown_object);
	if (ans < 0 || cc.x < 0) {
	    flags.verbose = save_verbose;
	    if (flags.verbose)
		pline(quick ? "Never mind." : "Done.");
	    return 0;	/* done */
	}
	flags.verbose = FALSE;	/* only print long question once */

	nh_describe_pos(cc.x, cc.y, &descbuf);
	
	otmp = vobj_at(cc.x, cc.y);
	if (otmp && is_plural(otmp))
	    objplur = 1;

	init_menulist(&menu);
	out_str[0] = '\0';
	if (append_str(out_str, descbuf.effectdesc, 0)) {
	    add_menuitem(&menu, 'e', descbuf.effectdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.effectdesc);
	}
	if (append_str(out_str, descbuf.invisdesc, 0)) {
	    add_menuitem(&menu, 'i', descbuf.invisdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.invisdesc);
	}
	if (append_str(out_str, descbuf.mondesc, 0)) {
	    add_menuitem(&menu, 'm', descbuf.mondesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.mondesc);
	}
	if (append_str(out_str, descbuf.objdesc, objplur)) {
	    add_menuitem(&menu, 'o', descbuf.objdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.objdesc);
	}
	if (append_str(out_str, descbuf.trapdesc, 0)) {
	    add_menuitem(&menu, 't', descbuf.trapdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.trapdesc);
	}
	if (append_str(out_str, descbuf.bgdesc, 0)) {
	    if (!found) {
		add_menuitem(&menu, 'b', descbuf.bgdesc, 0, FALSE);
		found++; /* only increment found if nothing else was seen,
		so that checkfile can be called below */
		strcpy (firstmatch, descbuf.bgdesc);
	    }
	}

	/* Finally, print out our explanation. */
	if (found) {
	    out_str[0] = highc(out_str[0]);
	    pline("%s.", out_str);
	    /* check the data file for information about this thing */
	    if (found > 0 && ans != LOOK_QUICK && ans != LOOK_ONCE &&
			(ans == LOOK_VERBOSE || !quick)) {
		if (found > 1) {
		    n = display_menu(menu.items, menu.icount, "More info?",
				     PICK_ONE, selected);
		    if (n == 1) {
			switch (selected[0]) {
			case 'e': strcpy(firstmatch, descbuf.effectdesc); break;
			case 'i': strcpy(firstmatch, descbuf.invisdesc); break;
			case 'm': strcpy(firstmatch, descbuf.mondesc); break;
			case 'o': strcpy(firstmatch, descbuf.objdesc); break;
			case 't': strcpy(firstmatch, descbuf.trapdesc); break;
			case 'b': strcpy(firstmatch, descbuf.bgdesc); break;
			}
		    }
		} else {
		    n = 1;
		}
		if (n == 1) {
		    /* Fake user_typed_name here when choosing from a menu above
		     * so players get feedback for missing database entries. */
		    checkfile(firstmatch, NULL, found > 1,
			      (ans == LOOK_VERBOSE || found > 1));
		}
	    }
	} else {
	    pline("I've never heard of such things.");
	}

	if (menu.icount)
	    free(menu.items);

	if (quick) check_tutorial_farlook(cc.x, cc.y);
    } while (!quick && ans != LOOK_ONCE);

    flags.verbose = save_verbose;
    if (!quick && flags.verbose)
	pline("Done.");

    return 0;
}